

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,long right,ValidityMask *mask,
                   idx_t idx)

{
  string_t str;
  anon_union_16_2_67f50693_for_value aVar1;
  
  str.value.pointer.ptr = (char *)fun.result;
  str.value._0_8_ = left.value.pointer.ptr;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       RepeatFunction::anon_class_8_1_6971b95b::operator()
                 ((anon_class_8_1_6971b95b *)left.value._0_8_,str,right);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}